

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O3

int dwarf_get_locdesc_entry_d
              (Dwarf_Loc_Head_c loclist_head,Dwarf_Unsigned index,Dwarf_Small *lle_value_out,
              Dwarf_Unsigned *rawval1,Dwarf_Unsigned *rawval2,Dwarf_Bool *debug_addr_unavailable,
              Dwarf_Addr *lowpc_out,Dwarf_Addr *hipc_out,Dwarf_Unsigned *loclist_expr_op_count_out,
              Dwarf_Locdesc_c_conflict *locdesc_entry_out,Dwarf_Small *loclist_source_out,
              Dwarf_Unsigned *expression_offset_out,Dwarf_Unsigned *locdesc_offset_out,
              Dwarf_Error *error)

{
  int iVar1;
  
  iVar1 = dwarf_get_locdesc_entry_e
                    (loclist_head,index,lle_value_out,rawval1,rawval2,debug_addr_unavailable,
                     lowpc_out,hipc_out,loclist_expr_op_count_out,(Dwarf_Unsigned *)0x0,
                     locdesc_entry_out,loclist_source_out,expression_offset_out,locdesc_offset_out,
                     error);
  return iVar1;
}

Assistant:

int
dwarf_get_locdesc_entry_d(Dwarf_Loc_Head_c loclist_head,
    Dwarf_Unsigned   index,
    /* Dwarf_Unsigned   lle_entry_index,  */
    Dwarf_Small    * lle_value_out,
    Dwarf_Unsigned * rawval1,
    Dwarf_Unsigned * rawval2,
    Dwarf_Bool     * debug_addr_unavailable,
    Dwarf_Addr     * lowpc_out, /* 'cooked' value */
    Dwarf_Addr     * hipc_out, /* 'cooked' value */
    Dwarf_Unsigned * loclist_expr_op_count_out,
    /* Returns pointer to the specific locdesc of the index; */
    Dwarf_Locdesc_c* locdesc_entry_out,
    Dwarf_Small    * loclist_source_out, /* 0,1, or 2 */
    Dwarf_Unsigned * expression_offset_out,
    Dwarf_Unsigned * locdesc_offset_out,
    Dwarf_Error    * error)
{
    return dwarf_get_locdesc_entry_e(
        loclist_head, index,
        /*0   base local index,*/
        lle_value_out,
        rawval1,
        rawval2,
        debug_addr_unavailable,
        lowpc_out, /* 'cooked' value */
        hipc_out, /* 'cooked' value */
        loclist_expr_op_count_out,
        0 /* not returning lle_bytecount*/ ,
        /* Returns pointer to the specific locdesc of the index; */
        locdesc_entry_out,
        loclist_source_out, /* 0,1, or 2 */
        expression_offset_out,
        locdesc_offset_out,
        error);
}